

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzquadrilateral.cpp
# Opt level: O1

void pztopology::TPZQuadrilateral::ComputeDirections
               (int side,TPZFMatrix<double> *gradx,TPZFMatrix<double> *directions,
               TPZVec<int> *sidevectors)

{
  int *piVar1;
  double *pdVar2;
  double *pdVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  TPZFMatrix<double> local_150;
  TPZFMatrix<double> local_c0;
  
  if ((gradx->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol == 2) {
    local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 2;
    local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0x12;
    local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFMatrix_0183c898;
    local_c0.fElem = (double *)0x0;
    local_c0.fGiven = (double *)0x0;
    local_c0.fSize = 0;
    TPZVec<int>::TPZVec(&local_c0.fPivot.super_TPZVec<int>,0);
    local_c0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
    local_c0.fPivot.super_TPZVec<int>.fStore = local_c0.fPivot.fExtAlloc;
    local_c0.fPivot.super_TPZVec<int>.fNElements = 0;
    local_c0.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_c0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
    local_c0.fWork.fStore = (double *)0x0;
    local_c0.fWork.fNElements = 0;
    local_c0.fWork.fNAlloc = 0;
    local_c0.fElem = (double *)operator_new__(0x120);
    local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 2;
    local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0x12;
    local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFMatrix_0183c898;
    local_150.fElem = (double *)0x0;
    local_150.fGiven = (double *)0x0;
    local_150.fSize = 0;
    TPZVec<int>::TPZVec(&local_150.fPivot.super_TPZVec<int>,0);
    local_150.fPivot.super_TPZVec<int>.fStore = local_150.fPivot.fExtAlloc;
    local_150.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
    local_150.fPivot.super_TPZVec<int>.fNElements = 0;
    local_150.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_150.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
    local_150.fWork.fStore = (double *)0x0;
    local_150.fWork.fNElements = 0;
    local_150.fWork.fNAlloc = 0;
    local_150.fElem = (double *)operator_new__(0x120);
    pdVar2 = local_c0.fElem;
    if (local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol *
        local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow != 0x24) {
      if ((local_c0.fElem != (double *)0x0) && (local_c0.fElem != local_c0.fGiven)) {
        operator_delete__(local_c0.fElem);
      }
      if ((local_c0.fGiven == (double *)0x0) || (pdVar2 = local_c0.fGiven, local_c0.fSize < 0x24)) {
        pdVar2 = (double *)operator_new__(0x120);
      }
    }
    local_c0.fElem = pdVar2;
    local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 2;
    local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0x12;
    (*local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xf])()
    ;
    pdVar2 = local_150.fElem;
    if (local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol *
        local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow != 0x24) {
      if ((local_150.fElem != (double *)0x0) && (local_150.fElem != local_150.fGiven)) {
        operator_delete__(local_150.fElem);
      }
      if ((local_150.fGiven == (double *)0x0) || (pdVar2 = local_150.fGiven, local_150.fSize < 0x24)
         ) {
        pdVar2 = (double *)operator_new__(0x120);
      }
    }
    local_150.fElem = pdVar2;
    local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 2;
    local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0x12;
    (*local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xf])
              ();
    (*(directions->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
      [0xe])(directions,3,0x12);
    lVar4 = 0;
    lVar5 = 0;
    pdVar2 = local_c0.fElem;
    pdVar3 = local_150.fElem;
    do {
      lVar6 = 0;
      do {
        *(undefined8 *)((long)pdVar2 + lVar6) = *(undefined8 *)((long)&bQuad + lVar4 + lVar6);
        *(undefined8 *)((long)pdVar3 + lVar6) = *(undefined8 *)((long)&tQuad + lVar4 + lVar6);
        lVar6 = lVar6 + 8;
      } while (lVar6 == 8);
      lVar5 = lVar5 + 1;
      lVar4 = lVar4 + 0x10;
      pdVar2 = pdVar2 + local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow;
      pdVar3 = pdVar3 + local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow;
    } while (lVar5 != 0x12);
    switch(side) {
    case 0:
    case 1:
    case 2:
    case 3:
      break;
    case 4:
      (*(directions->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
        [0xe])(directions,3,3);
      (*sidevectors->_vptr_TPZVec[3])(sidevectors,3);
      computedirectionsq(0,2,&local_c0,&local_150,gradx,directions);
      piVar1 = sidevectors->fStore;
      piVar1[0] = 0;
      piVar1[1] = 1;
      piVar1[2] = 4;
      break;
    case 5:
      (*(directions->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
        [0xe])(directions,3,3);
      (*sidevectors->_vptr_TPZVec[3])(sidevectors,3);
      computedirectionsq(3,5,&local_c0,&local_150,gradx,directions);
      piVar1 = sidevectors->fStore;
      piVar1[0] = 1;
      piVar1[1] = 2;
      piVar1[2] = 5;
      break;
    case 6:
      (*(directions->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
        [0xe])(directions,3,3);
      (*sidevectors->_vptr_TPZVec[3])(sidevectors,3);
      computedirectionsq(6,8,&local_c0,&local_150,gradx,directions);
      piVar1 = sidevectors->fStore;
      piVar1[0] = 2;
      piVar1[1] = 3;
      piVar1[2] = 6;
      break;
    case 7:
      (*(directions->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
        [0xe])(directions,3,3);
      (*sidevectors->_vptr_TPZVec[3])(sidevectors,3);
      computedirectionsq(9,0xb,&local_c0,&local_150,gradx,directions);
      piVar1 = sidevectors->fStore;
      piVar1[2] = 7;
      piVar1[0] = 3;
      piVar1[1] = 0;
      break;
    case 8:
      (*(directions->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
        [0xe])(directions,3,6);
      (*sidevectors->_vptr_TPZVec[3])(sidevectors,6);
      computedirectionsq(0xc,0x11,&local_c0,&local_150,gradx,directions);
      piVar1 = sidevectors->fStore;
      piVar1[0] = 4;
      piVar1[1] = 5;
      piVar1[2] = 6;
      piVar1[3] = 7;
      piVar1[4] = 8;
      piVar1[5] = 8;
      break;
    default:
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Topology/tpzquadrilateral.cpp"
                 ,0x44c);
    }
    TPZFMatrix<double>::~TPZFMatrix(&local_150);
    TPZFMatrix<double>::~TPZFMatrix(&local_c0);
    return;
  }
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Topology/tpzquadrilateral.cpp"
             ,0x3ef);
}

Assistant:

void TPZQuadrilateral::ComputeDirections(int side, TPZFMatrix<REAL> &gradx, TPZFMatrix<REAL> &directions, TPZVec<int> &sidevectors)
    {
        if(gradx.Cols()!=2)
        {
            DebugStop();
        }
        TPZFMatrix<REAL> bvec(2,18);
        TPZFMatrix<REAL> t1vec(2,18);
       
        bvec.Redim(2, 18);
        t1vec.Redim(2, 18);
        directions.Redim(3, 18);
        for (int lin = 0; lin<18; lin++)
        {
            for(int col = 0;col<2;col++)
            {
                bvec.PutVal(col, lin, bQuad[lin][col]);
                t1vec.PutVal(col, lin, tQuad[lin][col]);
            }
        }
        // calcula os vetores
        
        switch (side) {
            case 0:
            {
            }
                break;
            case 1:
            {
            }
                break;
            case 2:
            {
            }
                break;
            case 3:
            {
            }
                break;
            case 4:
            {
                directions.Redim(3, 3);
                sidevectors.Resize(3);
                int inumvec = 0, fnumvec = 2;
                computedirectionsq(inumvec, fnumvec, bvec, t1vec, gradx, directions);
                for (int ip = 0; ip < 3; ip++) {
                    sidevectors[ip] = vectorsideorder[ip];
                }
                
            }
                break;
            case 5:
            {
                directions.Redim(3, 3);
                sidevectors.Resize(3);
                int inumvec = 3, fnumvec = 5;
                computedirectionsq(inumvec, fnumvec, bvec, t1vec, gradx, directions);
                for (int ip = 0; ip < 3; ip++) {
                    sidevectors[ip] = vectorsideorder[ip+inumvec];
                }
            }
                break;
            case 6:
            {
                directions.Redim(3, 3);
                sidevectors.Resize(3);
                int inumvec = 6, fnumvec = 8;
                computedirectionsq(inumvec, fnumvec, bvec, t1vec, gradx, directions);
                for (int ip = 0; ip < 3; ip++) {
                    sidevectors[ip] = vectorsideorder[ip+inumvec];
                }
            }
                break;
            case 7:
            {
                directions.Redim(3, 3);
                sidevectors.Resize(3);
                int inumvec = 9, fnumvec = 11;
                computedirectionsq(inumvec, fnumvec, bvec, t1vec, gradx, directions);
                for (int ip = 0; ip < 3; ip++) {
                    sidevectors[ip] = vectorsideorder[ip+inumvec];
                }
            }
                break;
            case 8:
            {
                directions.Redim(3, 6);
                sidevectors.Resize(6);
                int inumvec = 12, fnumvec = 17;
                computedirectionsq(inumvec, fnumvec, bvec, t1vec, gradx, directions);
                for (int ip = 0; ip < 6; ip++) {
                    sidevectors[ip] = vectorsideorder[ip+inumvec];
                }
            }
                break;
                
            default:
                DebugStop();
                break;
        }

        
	}